

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall CodeGenGenericContext::LockReg(CodeGenGenericContext *this,x86Reg reg)

{
  x86Reg reg_local;
  CodeGenGenericContext *this_local;
  
  if (reg == this->lockedRegA) {
    __assert_fail("reg != lockedRegA",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x259,"void CodeGenGenericContext::LockReg(x86Reg)");
  }
  if (reg != this->lockedRegB) {
    if (this->lockedRegA == rRegCount) {
      this->lockedRegA = reg;
    }
    else {
      if (this->lockedRegB != rRegCount) {
        __assert_fail("!\"too many register locks\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x261,"void CodeGenGenericContext::LockReg(x86Reg)");
      }
      this->lockedRegB = reg;
    }
    return;
  }
  __assert_fail("reg != lockedRegB",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                ,0x25a,"void CodeGenGenericContext::LockReg(x86Reg)");
}

Assistant:

void CodeGenGenericContext::LockReg(x86Reg reg)
{
	assert(reg != lockedRegA);
	assert(reg != lockedRegB);

	if(lockedRegA == rRegCount)
		lockedRegA = reg;
	else if(lockedRegB == rRegCount)
		lockedRegB = reg;
	else
		assert(!"too many register locks");
}